

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O2

void addToDecreasingHeap(HighsInt *n,HighsInt mx_n,vector<double,_std::allocator<double>_> *heap_v,
                        vector<int,_std::allocator<int>_> *heap_ix,double v,HighsInt ix)

{
  pointer piVar1;
  ulong uVar2;
  pointer pdVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  iVar6 = *n;
  if (iVar6 < mx_n) {
    uVar5 = iVar6 + 1;
    *n = uVar5;
    pdVar3 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (long)(int)uVar5 / 2 & 0xffffffff;
    while ((uVar4 = (uint)uVar2, 0 < (int)uVar4 && (v < pdVar3[uVar2]))) {
      pdVar3[(int)uVar5] = pdVar3[uVar2];
      piVar1[(int)uVar5] = piVar1[uVar2];
      uVar5 = uVar4;
      uVar2 = (ulong)(uVar4 >> 1);
    }
  }
  else {
    pdVar3 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (v < pdVar3[1] || v == pdVar3[1]) goto LAB_0035f8e7;
    piVar1 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 2;
    uVar5 = 1;
    while ((int)uVar4 <= iVar6) {
      lVar7 = (long)(int)uVar4;
      uVar8 = uVar4;
      if ((int)uVar4 < iVar6) {
        uVar4 = uVar4 | 1;
        if (pdVar3[(int)uVar4] <= pdVar3[lVar7] && pdVar3[lVar7] != pdVar3[(int)uVar4]) {
          lVar7 = (long)(int)uVar4;
          uVar8 = uVar4;
        }
      }
      if (v <= pdVar3[lVar7]) break;
      pdVar3[(int)uVar5] = pdVar3[lVar7];
      piVar1[(int)uVar5] = piVar1[lVar7];
      iVar6 = *n;
      uVar5 = uVar8;
      uVar4 = uVar8 * 2;
    }
  }
  pdVar3[(int)uVar5] = v;
  (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [(int)uVar5] = ix;
LAB_0035f8e7:
  *(heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = 1;
  return;
}

Assistant:

void addToDecreasingHeap(HighsInt& n, HighsInt mx_n, vector<double>& heap_v,
                         vector<HighsInt>& heap_ix, const double v,
                         const HighsInt ix) {
  HighsInt cd_p, pa_p;
  if (n < mx_n) {
    // The heap is not full so put the new value at the bottom of the
    // heap and let it rise up to its correct level.
    n++;
    cd_p = n;
    pa_p = cd_p / 2;
    for (;;) {
      if (pa_p > 0) {
        if (v < heap_v[pa_p]) {
          heap_v[cd_p] = heap_v[pa_p];
          heap_ix[cd_p] = heap_ix[pa_p];
          cd_p = pa_p;
          pa_p = pa_p / 2;
          continue;
        }
      }
      break;
    }
    heap_v[cd_p] = v;
    heap_ix[cd_p] = ix;
  } else if (v > heap_v[1]) {
    // The heap is full so replace the least value with the new value
    // and let it sink down to its correct level.
    pa_p = 1;
    cd_p = pa_p + pa_p;
    for (;;) {
      if (cd_p <= n) {
        if (cd_p < n) {
          if (heap_v[cd_p] > heap_v[cd_p + 1]) cd_p++;
        }
        if (v > heap_v[cd_p]) {
          heap_v[pa_p] = heap_v[cd_p];
          heap_ix[pa_p] = heap_ix[cd_p];
          pa_p = cd_p;
          cd_p = cd_p + cd_p;
          continue;
        }
      }
      break;
    }
    heap_v[pa_p] = v;
    heap_ix[pa_p] = ix;
  }
  // Set heap_ix[0]=1 to indicate that the values form a heap.
  heap_ix[0] = 1;
  return;
}